

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

int32_t delta_from_arg_vals(rtosc_arg_val_t *llhsarg,rtosc_arg_val_t *lhsarg,rtosc_arg_val_t *rhsarg
                           ,rtosc_arg_val_t *delta,int must_be_unity)

{
  int iVar1;
  rtosc_arg_val_t *in_RCX;
  char *in_RDX;
  rtosc_arg_val_t *in_RSI;
  rtosc_arg_val_t *in_RDI;
  int in_R8D;
  rtosc_cmp_options cmp_options;
  rtosc_arg_val_t width2;
  rtosc_arg_val_t div;
  rtosc_arg_val_t width;
  int res;
  rtosc_arg_val_t null_val;
  int cmp;
  rtosc_arg_val_t *in_stack_ffffffffffffff58;
  rtosc_arg_val_t *in_stack_ffffffffffffff60;
  rtosc_arg_val_t *in_stack_ffffffffffffff68;
  rtosc_arg_val_t local_80;
  rtosc_arg_val_t local_68;
  int local_4c;
  rtosc_arg_val_t local_48;
  undefined4 in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_R8D == 0) {
    rtosc_arg_val_sub(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
    ;
    rtosc_arg_val_null(&local_48,in_RCX->type);
    iVar1 = rtosc_arg_vals_cmp(in_RDI,in_RSI,(size_t)in_RDX,(size_t)in_RCX,
                               (rtosc_cmp_options *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0));
  }
  else {
    iVar1 = rtosc_arg_vals_cmp(in_RDI,in_RSI,(size_t)in_RDX,(size_t)in_RCX,
                               (rtosc_cmp_options *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0));
    rtosc_arg_val_from_int(in_RCX,*in_RDX,1);
    if (0 < iVar1) {
      rtosc_arg_val_negate(in_RCX);
    }
  }
  if (iVar1 == 0) {
    local_4 = -1;
  }
  else {
    if (in_RDX == (char *)0x0) {
      local_4c = -1;
    }
    else {
      rtosc_arg_val_sub(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                        in_stack_ffffffffffffff58);
      rtosc_arg_val_div(&local_68,in_RCX,&local_80);
      rtosc_arg_val_round(&local_80);
      rtosc_arg_val_mult(&local_80,in_RCX,(rtosc_arg_val_t *)&stack0xffffffffffffff68);
      iVar1 = rtosc_arg_vals_eq(in_RDI,in_RSI,(size_t)in_RDX,(size_t)in_RCX,
                                (rtosc_cmp_options *)CONCAT44(in_R8D,iVar1));
      if (iVar1 == 0) {
        return -1;
      }
      rtosc_arg_val_to_int(&local_80,&local_4c);
    }
    local_4 = local_4c + 1;
  }
  return local_4;
}

Assistant:

int32_t delta_from_arg_vals(const rtosc_arg_val_t* llhsarg,
                            const rtosc_arg_val_t* lhsarg,
                            const rtosc_arg_val_t* rhsarg,
                            rtosc_arg_val_t* delta,
                            int must_be_unity)
{
    /*
        compute delta
    */
    int cmp;
    if(must_be_unity)
    {
        cmp = rtosc_arg_vals_cmp(lhsarg, rhsarg, 1, 1, NULL);
        rtosc_arg_val_from_int(delta, rhsarg->type, 1);
        if(cmp > 0)
            rtosc_arg_val_negate(delta);
    }
    else
    {
        rtosc_arg_val_sub(lhsarg, llhsarg, delta);
        rtosc_arg_val_t null_val;
        rtosc_arg_val_null(&null_val, delta->type);
        cmp = rtosc_arg_vals_cmp(delta, &null_val, 1, 1, NULL);
    }

    if(!cmp)
        return -1;

    /*
     * check if delta matches,
     * i.e. there's an "n" s. t. lhsarg + n*delta = rhsarg
     */
    int res;
    if(rhsarg)
    {
        rtosc_arg_val_t width, div, width2;
        rtosc_arg_val_sub(rhsarg, lhsarg, &width);
        rtosc_arg_val_div(&width, delta, &div);
        rtosc_arg_val_round(&div);
        rtosc_arg_val_mult(&div, delta, &width2);

        const rtosc_cmp_options cmp_options
         = ((rtosc_cmp_options) { 0.001 });
        if( ! rtosc_arg_vals_eq(&width, &width2, 1, 1, &cmp_options))
            return -1;

        rtosc_arg_val_to_int(&div, &res);
    }
    else
        res = -1; // return 0 to say "infinite range"
    return res + 1;
}